

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O3

void __thiscall
TypedObjectPool<detail::node<NULLC::Range>,_1024>::~TypedObjectPool
          (TypedObjectPool<detail::node<NULLC::Range>,_1024> *this)

{
  LargeBlock<detail::node<NULLC::Range>,_1024> *pLVar1;
  MyLargeBlock *pMVar2;
  
  this->freeBlocks = (MySmallBlock *)0x0;
  this->lastNum = 0x400;
  pMVar2 = this->activePages;
  while (pMVar2 != (MyLargeBlock *)0x0) {
    pLVar1 = pMVar2->next;
    (*(code *)NULLC::dealloc)(pMVar2);
    this->activePages = pLVar1;
    pMVar2 = pLVar1;
  }
  return;
}

Assistant:

void Reset()
	{
		freeBlocks = NULL;
		lastNum = countInBlock;

		while(activePages)
		{
			MyLargeBlock *following = activePages->next;
			NULLC::dealloc(activePages);
			activePages = following;
		}
	}